

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O3

bool __thiscall
cinatra::coro_http_client::add_str_part(coro_http_client *this,string *name,string *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>,_bool>
  pVar5;
  multipart_t local_78;
  
  sVar4 = content->_M_string_length;
  paVar2 = &local_78.filename.field_2;
  local_78.filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  paVar3 = &local_78.content.field_2;
  local_78.content._M_dataplus._M_p = (content->_M_dataplus)._M_p;
  paVar1 = &content->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.content._M_dataplus._M_p == paVar1) {
    local_78.content.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.content.field_2._8_8_ = *(undefined8 *)((long)&content->field_2 + 8);
    local_78.content._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_78.content.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_78.content._M_string_length = content->_M_string_length;
  (content->_M_dataplus)._M_p = (pointer)paVar1;
  content->_M_string_length = 0;
  (content->field_2)._M_local_buf[0] = '\0';
  local_78.size = sVar4;
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cinatra::multipart_t>,std::_Select1st<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>>
          ::_M_emplace_unique<std::__cxx11::string,cinatra::multipart_t>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cinatra::multipart_t>,std::_Select1st<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>>
                      *)&this->form_data_,name,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.content._M_dataplus._M_p != paVar3) {
    operator_delete(local_78.content._M_dataplus._M_p,
                    local_78.content.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.filename._M_dataplus._M_p,
                    local_78.filename.field_2._M_allocated_capacity + 1);
  }
  return (bool)(pVar5.second & 1);
}

Assistant:

bool add_str_part(std::string name, std::string content) {
    size_t size = content.size();
    return form_data_
        .emplace(std::move(name), multipart_t{"", std::move(content), size})
        .second;
  }